

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O2

int lws_tls_client_confirm_peer_cert(lws *wsi,char *ebuf,int ebuf_len)

{
  uchar *buf;
  int *piVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  
  buf = wsi->context->pt[wsi->tsi].serv_buf;
  piVar1 = __errno_location();
  *piVar1 = 0;
  ERR_clear_error();
  uVar2 = SSL_get_verify_result((SSL *)(wsi->tls).ssl);
  uVar4 = (uint)uVar2;
  _lws_log(0x10,"get_verify says %d\n",uVar2 & 0xffffffff);
  if (uVar4 == 0) {
    return 0;
  }
  if ((uVar4 & 0xfffffffe) == 0x12) {
    if (((wsi->tls).use_ssl & 2) == 0) {
LAB_00128b73:
      pcVar3 = ERR_error_string((long)(int)uVar4,(char *)buf);
      lws_snprintf(ebuf,(long)ebuf_len,"server\'s cert didn\'t look good, X509_V_ERR = %d: %s\n",
                   uVar2 & 0xffffffff,pcVar3);
      _lws_log(8,"%s\n",ebuf);
      lws_tls_err_describe_clear();
      return -1;
    }
    pcVar3 = "accepting self-signed certificate\n";
  }
  else if ((uVar4 - 9 < 2) && (((wsi->tls).use_ssl & 8) != 0)) {
    pcVar3 = "accepting expired certificate\n";
  }
  else {
    if (uVar4 != 9) goto LAB_00128b73;
    pcVar3 = "Cert is from the future... probably our clock... accepting...\n";
  }
  _lws_log(8,pcVar3);
  return 0;
}

Assistant:

int
lws_tls_client_confirm_peer_cert(struct lws *wsi, char *ebuf, int ebuf_len)
{
#if !defined(USE_WOLFSSL)
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	char *p = (char *)&pt->serv_buf[0];
	char *sb = p;
	int n;

	errno = 0;
	ERR_clear_error();
	n = SSL_get_verify_result(wsi->tls.ssl);

	lwsl_debug("get_verify says %d\n", n);

	if (n == X509_V_OK)
		return 0;

	if ((n == X509_V_ERR_DEPTH_ZERO_SELF_SIGNED_CERT ||
	     n == X509_V_ERR_SELF_SIGNED_CERT_IN_CHAIN) &&
	     (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)) {
		lwsl_info("accepting self-signed certificate\n");

		return 0;
	}
	if ((n == X509_V_ERR_CERT_NOT_YET_VALID ||
	     n == X509_V_ERR_CERT_HAS_EXPIRED) &&
	     (wsi->tls.use_ssl & LCCSCF_ALLOW_EXPIRED)) {
		lwsl_info("accepting expired certificate\n");
		return 0;
	}
	if (n == X509_V_ERR_CERT_NOT_YET_VALID) {
		lwsl_info("Cert is from the future... "
			    "probably our clock... accepting...\n");
		return 0;
	}
	lws_snprintf(ebuf, ebuf_len,
		"server's cert didn't look good, X509_V_ERR = %d: %s\n",
		 n, ERR_error_string(n, sb));
	lwsl_info("%s\n", ebuf);
	lws_tls_err_describe_clear();

	return -1;

#else /* USE_WOLFSSL */
	return 0;
#endif
}